

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_vtab *psVar1;
  sqlite3_module *psVar2;
  sqlite3_vtab *psVar3;
  char *pcVar4;
  u8 *a;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  sqlite3_module **ppsVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iOff;
  i64 iPos;
  int local_44;
  Fts5Buffer *local_40;
  Fts5IndexIter *local_38;
  
  psVar1 = pCursor->pVtab;
  local_44 = 0;
  psVar2 = pCursor[2].pVtab[1].pModule;
  iVar10 = *(int *)&psVar2->xBestIndex;
  lVar13 = (long)iVar10;
  pCursor[10].pVtab = (sqlite3_vtab *)((long)&(pCursor[10].pVtab)->pModule + 1);
  iVar6 = psVar1[2].nRef;
  if (iVar6 == 0) {
    uVar9 = (ulong)*(int *)&pCursor[7].pVtab;
    iVar12 = *(int *)&pCursor[7].pVtab + 1;
    uVar14 = uVar9;
    if (iVar12 < iVar10) {
      iVar12 = iVar10;
    }
    do {
      if (lVar13 <= (long)(uVar14 + 1)) {
        *(int *)&pCursor[7].pVtab = iVar12;
        goto LAB_001b04ea;
      }
      uVar7 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar7;
      lVar5 = uVar14 * 2;
      uVar14 = uVar14 + 1;
    } while (*(long *)(&(pCursor[9].pVtab)->nRef + lVar5) == 0);
    *(uint *)&pCursor[7].pVtab = uVar7;
    if ((int)uVar7 < iVar10) goto LAB_001b04fb;
  }
  else if (iVar6 == 2) {
    iVar10 = *(int *)((long)&psVar2->xColumn + 4);
    psVar1 = pCursor[4].pVtab;
    do {
      if ((iVar10 != 1) &&
         (iVar6 = sqlite3Fts5PoslistNext64
                            (*(u8 **)&psVar1->nRef,*(int *)&psVar1->zErrMsg,(int *)(pCursor + 0xe),
                             (i64 *)(pCursor + 0xd)), iVar6 == 0)) {
        return 0;
      }
      pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
      *(undefined4 *)&pCursor[0xe].pVtab = 0;
      iVar6 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCursor[4].pVtab);
      if (iVar6 != 0) break;
      iVar6 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
      if (iVar10 == 1) {
        return iVar6;
      }
      if (*(int *)&pCursor[3].pVtab != 0) {
        return iVar6;
      }
    } while (iVar6 == 0);
    *(undefined4 *)&pCursor[3].pVtab = 1;
    return iVar6;
  }
LAB_001b04ea:
  psVar3 = pCursor[4].pVtab;
  if (*(char *)((long)&psVar3->zErrMsg + 4) == '\0') {
    pcVar4 = psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 7].zErrMsg;
    iVar12 = *(int *)&psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 8].pModule + -1;
    iVar6 = *(int *)&pCursor[5].pVtab;
    if (-1 < iVar6) {
      iVar8 = iVar6;
      if (iVar12 < iVar6) {
        iVar8 = iVar12;
      }
      iVar8 = memcmp(pCursor[6].pVtab,pcVar4 + 1,(long)iVar8);
      if ((iVar8 < 0) || (iVar6 < iVar12 && iVar8 == 0)) {
        *(undefined4 *)&pCursor[3].pVtab = 1;
        return 0;
      }
    }
    sqlite3Fts5BufferSet(&local_44,(Fts5Buffer *)(pCursor + 0xb),iVar12,(u8 *)(pcVar4 + 1));
    memset(pCursor[8].pVtab,0,lVar13 * 8);
    memset(pCursor[9].pVtab,0,lVar13 * 8);
    *(undefined4 *)&pCursor[7].pVtab = 0;
    if (local_44 != 0) {
      return local_44;
    }
    iVar6 = psVar1[2].nRef;
    local_40 = (Fts5Buffer *)(pCursor + 0xb);
    do {
      iVar12 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xColumn + 4);
      iPos = 0;
      iOff = 0;
      local_38 = (Fts5IndexIter *)pCursor[4].pVtab;
      a = local_38->pData;
      iVar8 = local_38->nData;
      if (iVar6 == 0) {
        if (iVar12 == 0) {
          uVar14 = 0xffffffffffffffff;
          while (iVar6 = sqlite3Fts5PoslistNext64(a,iVar8,&iOff,&iPos), iVar6 == 0) {
            iVar6 = (int)((ulong)iPos >> 0x20);
            if ((int)uVar14 != iVar6) {
              if (iVar10 <= iVar6) {
                return 0x10b;
              }
              ppsVar11 = &(pCursor[9].pVtab)->pModule + (iPos >> 0x20);
              *ppsVar11 = (sqlite3_module *)((long)&(*ppsVar11)->iVersion + 1);
              uVar14 = (ulong)iPos >> 0x20;
            }
            ppsVar11 = &(pCursor[8].pVtab)->pModule + (iPos >> 0x20);
            *ppsVar11 = (sqlite3_module *)((long)&(*ppsVar11)->iVersion + 1);
          }
        }
        else {
          if (iVar12 != 2) goto LAB_001b067c;
          while (iVar6 = sqlite3Fts5PoslistNext64(a,iVar8,&iOff,&iPos), iVar6 == 0) {
            if (lVar13 <= iPos) {
              return 0x10b;
            }
            ppsVar11 = &(pCursor[9].pVtab)->pModule + iPos;
            *ppsVar11 = (sqlite3_module *)((long)&(*ppsVar11)->iVersion + 1);
          }
        }
      }
      else if (iVar6 == 1) {
        if (iVar12 == 0) {
          while (iVar6 = sqlite3Fts5PoslistNext64(a,iVar8,&iOff,&iPos), iVar6 == 0) {
            (pCursor[8].pVtab)->pModule =
                 (sqlite3_module *)((long)&(pCursor[8].pVtab)->pModule->iVersion + 1);
          }
        }
LAB_001b067c:
        (pCursor[9].pVtab)->pModule =
             (sqlite3_module *)((long)&(pCursor[9].pVtab)->pModule->iVersion + 1);
      }
      iVar12 = sqlite3Fts5IterNextScan(local_38);
      iVar6 = psVar1[2].nRef;
      if (iVar6 == 2) {
        if (iVar12 != 0) {
          return iVar12;
        }
        iVar6 = 2;
        goto LAB_001b04fb;
      }
      if (iVar12 != 0) {
        return iVar12;
      }
      psVar3 = pCursor[4].pVtab;
      uVar7 = *(int *)&psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 8].pModule - 1;
      if ((uVar7 != *(uint *)&pCursor[0xc].pVtab) ||
         (((1 < *(int *)&psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 8].pModule &&
           (iVar12 = bcmp(psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 7].zErrMsg + 1,
                          local_40->p,(ulong)uVar7), iVar12 != 0)) ||
          (*(char *)((long)&psVar3->zErrMsg + 4) != '\0')))) goto LAB_001b04fb;
    } while( true );
  }
  *(undefined4 *)&pCursor[3].pVtab = 1;
LAB_001b04fb:
  if (iVar6 == 0 && *(int *)&pCursor[3].pVtab == 0) {
    iVar10 = *(int *)&pCursor[7].pVtab;
    for (ppsVar11 = &(pCursor[9].pVtab)->pModule + iVar10; iVar10 = iVar10 + 1,
        *ppsVar11 == (sqlite3_module *)0x0; ppsVar11 = ppsVar11 + 1) {
      *(int *)&pCursor[7].pVtab = iVar10;
    }
  }
  return 0;
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int rc = SQLITE_OK;
  int nCol = pCsr->pFts5->pConfig->nCol;

  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            if( eDetail==FTS5_DETAIL_FULL ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                pCsr->aCnt[0]++;
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n 
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm)) 
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    while( pCsr->aDoc[pCsr->iCol]==0 ) pCsr->iCol++;
    assert( pCsr->iCol<pCsr->pFts5->pConfig->nCol );
  }
  return rc;
}